

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_exception_handler_test.cpp
# Opt level: O3

void __thiscall
StdExceptionCatcher_Tests::Test_that_std_exception_catcher_works::test_method
          (Test_that_std_exception_catcher_works *this)

{
  logic_error *this_00;
  GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::exception>_>
  catcher;
  
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"std::exception!");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

BOOST_AUTO_TEST_CASE(Test_that_std_exception_catcher_works)
{
   {
      auto catcher = std_exception_handler(EXIT_FAILURE, UnHandler<int>());
      try
      {
         throw_std_exception();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(EXIT_FAILURE, catcher.handleException());
      }
   }
   {
      auto catcher = std_exception_handler(EXIT_FAILURE); // default nest handler
      try
      {
         throw_std_exception();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(EXIT_FAILURE, catcher.handleException());
      }
   }

}